

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_verify(secp256k1_scalar *r)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  uint uVar6;
  undefined4 extraout_EAX;
  int iVar7;
  secp256k1_gej *psVar8;
  int64_t iVar9;
  int64_t iVar10;
  ulong uVar11;
  secp256k1_modinv64_signed62 *psVar12;
  byte bVar13;
  undefined4 uVar14;
  int iVar15;
  uint uVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *psVar18;
  ulong *extraout_RDX;
  long lVar19;
  long lVar20;
  long lVar21;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_00;
  secp256k1_modinv64_signed62 *b;
  secp256k1_gej *psVar22;
  secp256k1_gej *psVar23;
  secp256k1_gej *psVar24;
  long lVar25;
  secp256k1_gej *psVar26;
  uint uVar27;
  secp256k1_gej *psVar28;
  secp256k1_gej *a_00;
  secp256k1_modinv64_signed62 *psVar29;
  secp256k1_modinv64_signed62 *psVar30;
  secp256k1_fe *a_01;
  secp256k1_gej *a_02;
  secp256k1_gej *psVar31;
  secp256k1_modinv64_signed62 *a_03;
  secp256k1_gej *psVar32;
  ulong uVar33;
  ulong uVar34;
  secp256k1_gej *psVar35;
  uint64_t *puVar36;
  long lVar37;
  undefined1 *puVar38;
  secp256k1_gej *psVar39;
  long lVar40;
  ulong uVar41;
  secp256k1_gej *psVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  secp256k1_modinv64_signed62 sStack_338;
  secp256k1_modinv64_signed62 sStack_310;
  secp256k1_gej *psStack_2e8;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *psStack_2d8;
  ulong uStack_2d0;
  secp256k1_gej *psStack_2c8;
  ulong uStack_2c0;
  secp256k1_gej *psStack_2b8;
  secp256k1_gej *psStack_2b0;
  long lStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  secp256k1_gej *psStack_290;
  uint64_t uStack_288;
  secp256k1_gej *psStack_280;
  secp256k1_gej *psStack_278;
  secp256k1_gej *psStack_270;
  secp256k1_gej *psStack_268;
  uint64_t uStack_260;
  secp256k1_gej *psStack_258;
  secp256k1_gej *psStack_250;
  secp256k1_gej *psStack_248;
  secp256k1_gej *psStack_240;
  secp256k1_gej *psStack_238;
  secp256k1_gej *psStack_230;
  long lStack_228;
  secp256k1_gej *psStack_220;
  code *pcStack_218;
  uint uStack_20c;
  secp256k1_gej *psStack_208;
  secp256k1_gej *apsStack_200 [2];
  undefined1 auStack_1f0 [56];
  uint64_t uStack_1b8;
  uint64_t uStack_1b0;
  uint64_t uStack_1a8;
  uint64_t uStack_1a0;
  secp256k1_modinv64_trans2x2 sStack_190;
  undefined1 auStack_170 [96];
  ulong uStack_110;
  ulong uStack_108;
  secp256k1_gej *psStack_100;
  ulong uStack_f8;
  secp256k1_gej *psStack_f0;
  secp256k1_gej *psStack_e0;
  secp256k1_gej *psStack_d8;
  secp256k1_gej *psStack_c8;
  secp256k1_fe *psStack_c0;
  secp256k1_fe sStack_b8;
  secp256k1_fe *psStack_88;
  secp256k1_gej *psStack_80;
  code *pcStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  ulong uStack_48;
  secp256k1_gej *psStack_40;
  secp256k1_scalar *r_00;
  
  bVar47 = r->d[3] == 0xffffffffffffffff;
  uVar16 = (uint)((0xfffffffffffffffd < r->d[2] && bVar47) && 0xbaaedce6af48a03a < r->d[1]);
  uVar27 = 0;
  if (0xbaaedce6af48a03b < r->d[1]) {
    uVar27 = uVar16;
  }
  uVar27 = uVar27 | (r->d[2] == 0xffffffffffffffff && bVar47);
  r_00 = (secp256k1_scalar *)(ulong)uVar27;
  uVar6 = 0;
  if (0xbfd25e8cd0364140 < r->d[0]) {
    uVar6 = uVar16;
  }
  if (uVar6 == 0 && uVar27 == 0) {
    return;
  }
  secp256k1_scalar_verify_cold_1();
  pcStack_78 = (code *)0x14a93b;
  secp256k1_scalar_verify(r_00);
  uStack_70 = r_00->d[2] | r_00->d[0];
  uStack_68 = r_00->d[3] | r_00->d[1];
  pcStack_78 = (code *)0x14a953;
  secp256k1_scalar_verify(r_00);
  uVar41 = r_00->d[0];
  uVar44 = r_00->d[1];
  uVar11 = r_00->d[2];
  uVar33 = r_00->d[3];
  pcStack_78 = (code *)0x14a96a;
  secp256k1_scalar_verify(r_00);
  uVar14 = 0xffffffff;
  uVar45 = uVar41 & 0x3fffffffffffffff;
  uVar41 = (uVar44 & 0xfffffffffffffff) << 2 | uVar41 >> 0x3e;
  uVar44 = (uVar11 & 0x3ffffffffffffff) << 4 | uVar44 >> 0x3c;
  uStack_48 = (uVar33 & 0xffffffffffffff) << 6 | uVar11 >> 0x3a;
  psVar26 = (secp256k1_gej *)(uVar33 >> 0x38);
  pcStack_78 = (code *)0x14a9bd;
  uStack_60 = uVar45;
  uStack_58 = uVar41;
  uStack_50 = uVar44;
  psStack_40 = psVar26;
  secp256k1_modinv64_var
            ((secp256k1_modinv64_signed62 *)&stack0xffffffffffffffa0,&secp256k1_const_modinfo_scalar
            );
  pcStack_78 = (code *)0x14a9c8;
  psVar28 = (secp256k1_gej *)&stack0xffffffffffffffa0;
  secp256k1_scalar_from_signed62(r,(secp256k1_modinv64_signed62 *)&stack0xffffffffffffffa0);
  pcStack_78 = (code *)0x14a9d0;
  secp256k1_scalar_verify(r);
  pcStack_78 = (code *)0x14a9d8;
  a_01 = (secp256k1_fe *)r;
  secp256k1_scalar_verify(r);
  auVar48._0_4_ =
       -(uint)((int)((secp256k1_fe *)r)->n[2] == 0 && (int)((secp256k1_fe *)r)->n[0] == 0);
  auVar48._4_4_ =
       -(uint)(*(int *)((long)((secp256k1_fe *)r)->n + 0x14) == 0 &&
              *(int *)((long)((secp256k1_fe *)r)->n + 4) == 0);
  auVar48._8_4_ =
       -(uint)((int)((secp256k1_fe *)r)->n[3] == 0 && (int)((secp256k1_fe *)r)->n[1] == 0);
  auVar48._12_4_ =
       -(uint)(*(int *)((long)((secp256k1_fe *)r)->n + 0x1c) == 0 &&
              *(int *)((long)((secp256k1_fe *)r)->n + 0xc) == 0);
  iVar7 = movmskps(extraout_EAX,auVar48);
  auVar49._0_4_ = -(uint)((int)uStack_70 == 0);
  auVar49._4_4_ = -(uint)(uStack_70._4_4_ == 0);
  auVar49._8_4_ = -(uint)((int)uStack_68 == 0);
  auVar49._12_4_ = -(uint)(uStack_68._4_4_ == 0);
  iVar15 = movmskps(uVar14,auVar49);
  if ((iVar15 != 0xf) != (iVar7 == 0xf)) {
    return;
  }
  pcStack_78 = secp256k1_gej_eq_x_var;
  secp256k1_scalar_inverse_var_cold_1();
  psStack_c0 = (secp256k1_fe *)0x14aa34;
  psVar22 = psVar28;
  psStack_88 = (secp256k1_fe *)r;
  psStack_80 = (secp256k1_gej *)&stack0xffffffffffffffa0;
  pcStack_78 = (code *)uVar45;
  secp256k1_fe_verify(a_01);
  psStack_c0 = (secp256k1_fe *)0x14aa3c;
  psVar31 = psVar28;
  secp256k1_gej_verify(psVar28);
  if (psVar28->infinity == 0) {
    psStack_c0 = (secp256k1_fe *)0x14aa54;
    secp256k1_fe_sqr(&sStack_b8,&psVar28->z);
    psStack_c0 = (secp256k1_fe *)0x14aa62;
    secp256k1_fe_mul(&sStack_b8,&sStack_b8,a_01);
    psStack_c0 = (secp256k1_fe *)0x14aa6d;
    secp256k1_fe_equal(&sStack_b8,&psVar28->x);
    return;
  }
  psStack_c0 = (secp256k1_fe *)secp256k1_fe_cmp_var;
  secp256k1_gej_eq_x_var_cold_1();
  psStack_d8 = (secp256k1_gej *)0x14aa8b;
  psVar18 = psVar22;
  psStack_c8 = psVar28;
  psStack_c0 = a_01;
  secp256k1_fe_verify(&psVar31->x);
  psStack_d8 = (secp256k1_gej *)0x14aa93;
  psVar28 = psVar22;
  secp256k1_fe_verify(&psVar22->x);
  if ((psVar31->x).normalized == 0) {
    psStack_d8 = (secp256k1_gej *)0x14aad5;
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar22->x).normalized != 0) {
    uVar27 = 4;
    while( true ) {
      uVar41 = (psVar22->x).n[uVar27];
      uVar44 = (psVar31->x).n[uVar27];
      if (uVar44 >= uVar41 && uVar44 != uVar41) {
        return;
      }
      if (uVar44 < uVar41) break;
      bVar47 = uVar27 == 0;
      uVar27 = uVar27 - 1;
      if (bVar47) {
        return;
      }
    }
    return;
  }
  psStack_d8 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_cmp_var_cold_1();
  psStack_f0 = (secp256k1_gej *)0x14aae9;
  psVar23 = psVar18;
  psStack_e0 = psVar22;
  psStack_d8 = psVar31;
  secp256k1_fe_verify(&psVar28->x);
  psStack_f0 = (secp256k1_gej *)0x14aaf1;
  psVar22 = psVar18;
  secp256k1_fe_verify(&psVar18->x);
  iVar7 = (psVar18->x).magnitude + (psVar28->x).magnitude;
  if (iVar7 < 0x21) {
    (psVar28->x).n[0] = (psVar28->x).n[0] + (psVar18->x).n[0];
    puVar36 = (psVar28->x).n + 1;
    *puVar36 = *puVar36 + (psVar18->x).n[1];
    puVar36 = (psVar28->x).n + 2;
    *puVar36 = *puVar36 + (psVar18->x).n[2];
    puVar36 = (psVar28->x).n + 3;
    *puVar36 = *puVar36 + (psVar18->x).n[3];
    puVar36 = (psVar28->x).n + 4;
    *puVar36 = *puVar36 + (psVar18->x).n[4];
    (psVar28->x).magnitude = iVar7;
    (psVar28->x).normalized = 0;
    secp256k1_fe_verify(&psVar28->x);
    return;
  }
  psStack_f0 = (secp256k1_gej *)secp256k1_modinv64_var;
  secp256k1_fe_add_cold_1();
  psStack_f0 = psVar26;
  uStack_f8 = uVar45;
  psStack_100 = psVar18;
  uStack_108 = uVar44;
  uStack_110 = uVar41;
  auStack_170._88_8_ = psVar28;
  auStack_170._16_8_ = 0;
  auStack_170._24_8_ = 0;
  auStack_170._0_8_ = 0;
  auStack_170._8_8_ = 0;
  psVar28 = (secp256k1_gej *)0x0;
  auStack_170._32_8_ = 0;
  auStack_170._56_8_ = 0;
  auStack_170._80_8_ = 0;
  auStack_170._64_8_ = 0;
  auStack_170._72_8_ = 0;
  auStack_170._48_8_ = 1;
  uStack_1a0 = (psVar23->x).n[4];
  uStack_1b0 = (psVar23->x).n[2];
  uStack_1a8 = (psVar23->x).n[3];
  auStack_1f0._48_8_ = (secp256k1_gej *)(psVar23->x).n[0];
  uStack_1b8 = (psVar23->x).n[1];
  auStack_1f0._32_8_ = (psVar22->x).n[4];
  auStack_1f0._0_8_ = (psVar22->x).n[0];
  auStack_1f0._8_8_ = (psVar22->x).n[1];
  psStack_208 = psVar22;
  auStack_1f0._16_8_ = (psVar22->x).n[2];
  auStack_1f0._24_8_ = (psVar22->x).n[3];
  lVar46 = -1;
  psVar22 = (secp256k1_gej *)0x5;
  apsStack_200[0] = psVar23;
  do {
    psVar31 = (secp256k1_gej *)auStack_1f0._48_8_;
    psVar24 = apsStack_200[0];
    uStack_20c = (uint)psVar22;
    psVar8 = (secp256k1_gej *)0x0;
    psVar35 = (secp256k1_gej *)0x0;
    psVar32 = (secp256k1_gej *)0x1;
    uVar27 = 0x3e;
    a_00 = (secp256k1_gej *)0x1;
    puVar38 = (undefined1 *)auStack_1f0._0_8_;
    psVar18 = (secp256k1_gej *)auStack_1f0._48_8_;
    while( true ) {
      a_02 = (secp256k1_gej *)(-1L << ((byte)uVar27 & 0x3f) | (ulong)puVar38);
      psVar17 = (secp256k1_gej *)0x0;
      if (a_02 != (secp256k1_gej *)0x0) {
        for (; ((ulong)a_02 >> (long)psVar17 & 1) == 0;
            psVar17 = (secp256k1_gej *)((long)(psVar17->x).n + 1)) {
        }
      }
      bVar13 = (byte)psVar17;
      psVar39 = (secp256k1_gej *)((ulong)puVar38 >> (bVar13 & 0x3f));
      a_00 = (secp256k1_gej *)((long)a_00 << (bVar13 & 0x3f));
      psVar8 = (secp256k1_gej *)((long)psVar8 << (bVar13 & 0x3f));
      lVar46 = lVar46 - (long)psVar17;
      uVar27 = uVar27 - (int)psVar17;
      apsStack_200[1] = psVar28;
      if (uVar27 == 0) break;
      if (((ulong)psVar18 & 1) == 0) {
        pcStack_218 = (code *)0x14b063;
        secp256k1_modinv64_var_cold_8();
LAB_0014b063:
        pcStack_218 = (code *)0x14b068;
        secp256k1_modinv64_var_cold_7();
LAB_0014b068:
        pcStack_218 = (code *)0x14b06d;
        secp256k1_modinv64_var_cold_1();
LAB_0014b06d:
        pcStack_218 = (code *)0x14b072;
        secp256k1_modinv64_var_cold_2();
LAB_0014b072:
        pcStack_218 = (code *)0x14b077;
        secp256k1_modinv64_var_cold_6();
        psVar39 = psVar18;
        goto LAB_0014b077;
      }
      if (((ulong)psVar39 & 1) == 0) goto LAB_0014b063;
      a_02 = (secp256k1_gej *)((long)psVar8 * auStack_1f0._0_8_ + (long)a_00 * auStack_1f0._48_8_);
      psVar17 = (secp256k1_gej *)(ulong)(0x3e - uVar27);
      bVar13 = (byte)(0x3e - uVar27);
      psVar22 = (secp256k1_gej *)((long)psVar18 << (bVar13 & 0x3f));
      if (a_02 != psVar22) goto LAB_0014b068;
      psVar22 = (secp256k1_gej *)
                ((long)psVar32 * auStack_1f0._0_8_ + (long)psVar35 * auStack_1f0._48_8_);
      a_02 = (secp256k1_gej *)((long)psVar39 << (bVar13 & 0x3f));
      if (psVar22 != a_02) goto LAB_0014b06d;
      psVar17 = (secp256k1_gej *)(lVar46 - 0x2ea);
      if (psVar17 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_0014b072;
      iVar7 = (int)psVar39;
      if (lVar46 < 0) {
        lVar46 = -lVar46;
        uVar16 = (int)lVar46 + 1;
        if ((int)uVar27 <= (int)uVar16) {
          uVar16 = uVar27;
        }
        psVar17 = (secp256k1_gej *)(ulong)uVar16;
        a_02 = (secp256k1_gej *)(ulong)(uVar16 - 0x3f);
        if (0xffffffc1 < uVar16 - 0x3f) {
          psVar42 = (secp256k1_gej *)-(long)psVar8;
          psVar26 = (secp256k1_gej *)-(long)a_00;
          psVar17 = (secp256k1_gej *)-(long)psVar18;
          psVar22 = (secp256k1_gej *)
                    ((ulong)(0x3fL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
          uVar16 = (iVar7 * iVar7 + 0x3e) * iVar7 * (int)psVar17 & (uint)psVar22;
          psVar8 = psVar32;
          a_00 = psVar35;
          psVar23 = psVar42;
          goto LAB_0014ad3d;
        }
        goto LAB_0014b081;
      }
      uVar16 = (int)lVar46 + 1;
      if ((int)uVar27 <= (int)uVar16) {
        uVar16 = uVar27;
      }
      psVar17 = (secp256k1_gej *)(ulong)uVar16;
      a_02 = (secp256k1_gej *)(ulong)(uVar16 - 0x3f);
      if (uVar16 - 0x3f < 0xffffffc2) goto LAB_0014b07c;
      psVar22 = (secp256k1_gej *)
                ((ulong)(0xfL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
      uVar16 = -(iVar7 * (((int)psVar18 * 2 + 2U & 8) + (int)psVar18)) & (uint)psVar22;
      psVar26 = psVar35;
      psVar42 = psVar32;
      psVar17 = psVar39;
      psVar39 = psVar18;
LAB_0014ad3d:
      uVar41 = (ulong)uVar16;
      a_02 = (secp256k1_gej *)(uVar41 * (long)psVar39);
      puVar38 = (undefined1 *)((long)(psVar17->x).n + (long)(a_02->x).n);
      psVar35 = (secp256k1_gej *)((long)(psVar26->x).n + (long)a_00 * uVar41);
      psVar17 = (secp256k1_gej *)(uVar41 * (long)psVar8);
      psVar32 = (secp256k1_gej *)((long)(psVar42->x).n + (long)(psVar17->x).n);
      psVar18 = psVar39;
      if (((ulong)puVar38 & (ulong)psVar22) != 0) {
LAB_0014b077:
        pcStack_218 = (code *)0x14b07c;
        secp256k1_modinv64_var_cold_4();
        psVar18 = psVar39;
LAB_0014b07c:
        pcStack_218 = (code *)0x14b081;
        secp256k1_modinv64_var_cold_3();
LAB_0014b081:
        pcStack_218 = (code *)0x14b086;
        secp256k1_modinv64_var_cold_5();
        goto LAB_0014b086;
      }
    }
    a_02 = (secp256k1_gej *)((long)psVar8 * (long)psVar35);
    psVar17 = SUB168(SEXT816((long)psVar8) * SEXT816((long)psVar35),8);
    sStack_190.u = (int64_t)a_00;
    sStack_190.v = (int64_t)psVar8;
    sStack_190.q = (int64_t)psVar35;
    sStack_190.r = (int64_t)psVar32;
    if ((long)a_00 * (long)psVar32 - (long)a_02 != 0x4000000000000000 ||
        SUB168(SEXT816((long)a_00) * SEXT816((long)psVar32),8) - (long)psVar17 !=
        (ulong)((secp256k1_gej *)((long)a_00 * (long)psVar32) < a_02)) {
LAB_0014b086:
      pcStack_218 = (code *)0x14b08b;
      secp256k1_modinv64_var_cold_9();
      psVar24 = psVar23;
LAB_0014b08b:
      pcStack_218 = (code *)0x14b090;
      secp256k1_modinv64_var_cold_20();
LAB_0014b090:
      pcStack_218 = (code *)0x14b095;
      secp256k1_modinv64_var_cold_19();
LAB_0014b095:
      pcStack_218 = (code *)0x14b09a;
      secp256k1_modinv64_var_cold_18();
      psVar28 = psVar31;
LAB_0014b09a:
      pcStack_218 = (code *)0x14b09f;
      secp256k1_modinv64_var_cold_17();
LAB_0014b09f:
      pcStack_218 = (code *)0x14b0a4;
      secp256k1_modinv64_var_cold_14();
LAB_0014b0a4:
      pcStack_218 = (code *)0x14b0a9;
      secp256k1_modinv64_var_cold_13();
LAB_0014b0a9:
      pcStack_218 = (code *)0x14b0ae;
      secp256k1_modinv64_var_cold_12();
LAB_0014b0ae:
      pcStack_218 = (code *)0x14b0b3;
      secp256k1_modinv64_var_cold_11();
LAB_0014b0b3:
      pcStack_218 = (code *)0x14b0b8;
      secp256k1_modinv64_var_cold_10();
      goto LAB_0014b0b8;
    }
    pcStack_218 = (code *)0x14adcb;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_170,
               (secp256k1_modinv64_signed62 *)(auStack_170 + 0x30),&sStack_190,
               (secp256k1_modinv64_modinfo *)apsStack_200[0]);
    uVar27 = uStack_20c;
    psVar18 = (secp256k1_gej *)(auStack_1f0 + 0x30);
    psVar22 = (secp256k1_gej *)(ulong)uStack_20c;
    a_00 = (secp256k1_gej *)(ulong)uStack_20c;
    psVar17 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_218 = (code *)0x14ade8;
    a_02 = psVar18;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,uStack_20c,
                       (secp256k1_modinv64_signed62 *)psVar24,-1);
    if (iVar7 < 1) goto LAB_0014b08b;
    psVar17 = (secp256k1_gej *)0x1;
    a_00 = (secp256k1_gej *)(ulong)uVar27;
    pcStack_218 = (code *)0x14ae02;
    a_02 = psVar18;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,uVar27,
                       (secp256k1_modinv64_signed62 *)psVar24,1);
    if (0 < iVar7) goto LAB_0014b090;
    psVar31 = (secp256k1_gej *)auStack_1f0;
    a_00 = (secp256k1_gej *)(ulong)uVar27;
    psVar17 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_218 = (code *)0x14ae23;
    a_02 = psVar31;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar31,uVar27,
                       (secp256k1_modinv64_signed62 *)psVar24,-1);
    if (iVar7 < 1) goto LAB_0014b095;
    psVar17 = (secp256k1_gej *)0x1;
    a_00 = (secp256k1_gej *)(ulong)uVar27;
    pcStack_218 = (code *)0x14ae3d;
    a_02 = psVar31;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar31,uVar27,
                       (secp256k1_modinv64_signed62 *)psVar24,1);
    psVar28 = psVar31;
    if (-1 < iVar7) goto LAB_0014b09a;
    pcStack_218 = (code *)0x14ae5a;
    secp256k1_modinv64_update_fg_62_var
              (uVar27,(secp256k1_modinv64_signed62 *)psVar18,(secp256k1_modinv64_signed62 *)psVar31,
               &sStack_190);
    psVar28 = apsStack_200[1];
    if ((undefined1 *)auStack_1f0._0_8_ != (undefined1 *)0x0) {
LAB_0014ae6b:
      lVar19 = (long)(int)uVar27;
      uVar41 = *(ulong *)(auStack_1f0 + lVar19 * 8 + 0x28);
      psVar17 = apsStack_200[lVar19 + 1];
      a_02 = (secp256k1_gej *)((long)uVar41 >> 0x3f ^ uVar41 | lVar19 + -2 >> 0x3f);
      a_00 = (secp256k1_gej *)((long)psVar17 >> 0x3f ^ (ulong)psVar17 | (ulong)a_02);
      if (a_00 == (secp256k1_gej *)0x0) {
        psVar22 = (secp256k1_gej *)(ulong)(uVar27 - 1);
        *(ulong *)(auStack_1f0 + lVar19 * 8 + 0x20) =
             *(ulong *)(auStack_1f0 + lVar19 * 8 + 0x20) | uVar41 << 0x3e;
        psVar17 = (secp256k1_gej *)((long)psVar17 << 0x3e);
        apsStack_200[lVar19] = (secp256k1_gej *)((ulong)apsStack_200[lVar19] | (ulong)psVar17);
      }
      if (10 < (int)psVar28) goto LAB_0014b09f;
      psVar17 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_218 = (code *)0x14aece;
      iVar15 = (int)psVar22;
      a_00 = psVar22;
      a_02 = psVar18;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,iVar15,
                         (secp256k1_modinv64_signed62 *)psVar24,-1);
      if (iVar7 < 1) goto LAB_0014b0a4;
      psVar17 = (secp256k1_gej *)0x1;
      pcStack_218 = (code *)0x14aee8;
      a_00 = psVar22;
      a_02 = psVar18;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,iVar15,
                         (secp256k1_modinv64_signed62 *)psVar24,1);
      if (0 < iVar7) goto LAB_0014b0a9;
      psVar18 = (secp256k1_gej *)auStack_1f0;
      psVar17 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_218 = (code *)0x14af09;
      a_00 = psVar22;
      a_02 = psVar18;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,iVar15,
                         (secp256k1_modinv64_signed62 *)psVar24,-1);
      if (iVar7 < 1) goto LAB_0014b0ae;
      psVar17 = (secp256k1_gej *)0x1;
      pcStack_218 = (code *)0x14af23;
      a_00 = psVar22;
      a_02 = psVar18;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,iVar15,
                         (secp256k1_modinv64_signed62 *)psVar24,1);
      if (iVar7 < 0) {
        bVar47 = true;
        psVar28 = (secp256k1_gej *)(ulong)((int)psVar28 + 1);
        goto LAB_0014af58;
      }
      goto LAB_0014b0b3;
    }
    if (1 < (int)uVar27) {
      uVar41 = 1;
      uVar44 = 0;
      do {
        uVar44 = uVar44 | *(ulong *)(auStack_1f0 + uVar41 * 8);
        uVar41 = uVar41 + 1;
      } while (uVar27 != uVar41);
      if (uVar44 != 0) goto LAB_0014ae6b;
    }
    bVar47 = false;
LAB_0014af58:
    psVar23 = psVar24;
  } while (bVar47);
  a_02 = (secp256k1_gej *)auStack_1f0;
  iVar15 = (int)psVar22;
  psVar17 = (secp256k1_gej *)0x0;
  pcStack_218 = (code *)0x14af75;
  a_00 = psVar22;
  iVar7 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_02,iVar15,&SECP256K1_SIGNED62_ONE,0);
  if (iVar7 == 0) {
    pcStack_218 = (code *)0x14af97;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)(auStack_1f0 + 0x30),iVar15,
                       &SECP256K1_SIGNED62_ONE,-1);
    psVar28 = psStack_208;
    if (iVar7 == 0) {
LAB_0014b019:
      pcStack_218 = (code *)0x14b034;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_170,
                 *(int64_t *)(auStack_1f0 + (long)iVar15 * 8 + 0x28),
                 (secp256k1_modinv64_modinfo *)psVar24);
      (psVar28->x).n[4] = auStack_170._32_8_;
      (psVar28->x).n[2] = auStack_170._16_8_;
      (psVar28->x).n[3] = auStack_170._24_8_;
      (psVar28->x).n[0] = auStack_170._0_8_;
      (psVar28->x).n[1] = auStack_170._8_8_;
      return;
    }
    pcStack_218 = (code *)0x14afb8;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)(auStack_1f0 + 0x30),iVar15,
                       &SECP256K1_SIGNED62_ONE,1);
    if (iVar7 == 0) goto LAB_0014b019;
    a_00 = (secp256k1_gej *)0x5;
    psVar17 = (secp256k1_gej *)0x0;
    pcStack_218 = (code *)0x14afd2;
    a_02 = psVar28;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar7 == 0) {
      a_02 = (secp256k1_gej *)auStack_170;
      a_00 = (secp256k1_gej *)0x5;
      psVar17 = (secp256k1_gej *)0x0;
      pcStack_218 = (code *)0x14aff5;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_02,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar7 == 0) {
        a_02 = (secp256k1_gej *)(auStack_1f0 + 0x30);
        psVar17 = (secp256k1_gej *)0x1;
        pcStack_218 = (code *)0x14b011;
        a_00 = psVar22;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_02,iVar15,
                           (secp256k1_modinv64_signed62 *)psVar24,1);
        if (iVar7 == 0) goto LAB_0014b019;
      }
    }
  }
  else {
LAB_0014b0b8:
    pcStack_218 = (code *)0x14b0bd;
    secp256k1_modinv64_var_cold_15();
  }
  pcStack_218 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  uVar41 = (a_00->x).n[0];
  if (uVar41 >> 0x3e == 0) {
    uVar44 = (a_00->x).n[1];
    if (0x3fffffffffffffff < uVar44) goto LAB_0014b14c;
    psVar17 = (secp256k1_gej *)(a_00->x).n[2];
    if ((secp256k1_gej *)0x3fffffffffffffff < psVar17) goto LAB_0014b151;
    uVar11 = (a_00->x).n[3];
    if (0x3fffffffffffffff < uVar11) goto LAB_0014b156;
    a_00 = (secp256k1_gej *)(a_00->x).n[4];
    if (a_00 < (secp256k1_gej *)&DAT_00000100) {
      (a_02->x).n[0] = uVar44 << 0x3e | uVar41;
      (a_02->x).n[1] = (long)psVar17 << 0x3c | uVar44 >> 2;
      (a_02->x).n[2] = uVar11 << 0x3a | (ulong)psVar17 >> 4;
      (a_02->x).n[3] = (long)a_00 << 0x38 | uVar11 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_02);
      return;
    }
  }
  else {
    psStack_220 = (secp256k1_gej *)0x14b14c;
    secp256k1_scalar_from_signed62_cold_5();
LAB_0014b14c:
    psStack_220 = (secp256k1_gej *)0x14b151;
    secp256k1_scalar_from_signed62_cold_4();
LAB_0014b151:
    psStack_220 = (secp256k1_gej *)0x14b156;
    secp256k1_scalar_from_signed62_cold_3();
LAB_0014b156:
    psStack_220 = (secp256k1_gej *)0x14b15b;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_220 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_220 = psVar26;
  lStack_228 = lVar46;
  psStack_230 = psVar28;
  psStack_238 = psVar18;
  psStack_240 = psVar24;
  psStack_248 = psVar22;
  uVar1 = (a_02->x).n[0];
  psStack_258 = (secp256k1_gej *)(a_02->x).n[1];
  psStack_268 = (secp256k1_gej *)(a_02->x).n[2];
  uStack_288 = (a_02->x).n[3];
  psStack_278 = (secp256k1_gej *)(a_02->x).n[4];
  psVar26 = (secp256k1_gej *)(a_00->x).n[0];
  psStack_250 = (secp256k1_gej *)(a_00->x).n[1];
  uStack_260 = (a_00->x).n[2];
  uStack_2c0 = *extraout_RDX;
  psStack_2b8 = (secp256k1_gej *)extraout_RDX[1];
  uStack_2d0 = extraout_RDX[2];
  psStack_2c8 = (secp256k1_gej *)extraout_RDX[3];
  psVar28 = (secp256k1_gej *)(a_00->x).n[3];
  psStack_280 = (secp256k1_gej *)(a_00->x).n[4];
  psVar22 = (secp256k1_gej *)0x5;
  psVar18 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_2d8 = (secp256k1_gej *)0x14b1fc;
  psVar31 = a_02;
  iVar7 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar17,-2
                    );
  if (iVar7 < 1) {
    psStack_2d8 = (secp256k1_gej *)0x14bd1c;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014bd1c:
    psStack_2d8 = (secp256k1_gej *)0x14bd21;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014bd21:
    psStack_2d8 = (secp256k1_gej *)0x14bd26;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014bd26:
    psStack_2d8 = (secp256k1_gej *)0x14bd2b;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014bd2b:
    psStack_2d8 = (secp256k1_gej *)0x14bd30;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_0014bd30:
    psStack_2d8 = (secp256k1_gej *)0x14bd35;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014bd35:
    psStack_2d8 = (secp256k1_gej *)0x14bd3a;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0014bd3a:
    psStack_2d8 = (secp256k1_gej *)0x14bd3f;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar23 = psVar17;
LAB_0014bd3f:
    psStack_2d8 = (secp256k1_gej *)0x14bd44;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_0014bd44:
    psStack_2d8 = (secp256k1_gej *)0x14bd49;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0014bd49:
    psStack_2d8 = (secp256k1_gej *)0x14bd4e;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar24 = psVar23;
LAB_0014bd4e:
    psStack_2d8 = (secp256k1_gej *)0x14bd53;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_0014bd53:
    psStack_2d8 = (secp256k1_gej *)0x14bd58;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_0014bd58:
    psStack_2d8 = (secp256k1_gej *)0x14bd5d;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0014bd5d:
    psStack_2d8 = (secp256k1_gej *)0x14bd62;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0014bd62:
    psStack_2d8 = (secp256k1_gej *)0x14bd67;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0014bd67:
    psStack_2d8 = (secp256k1_gej *)0x14bd6c;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_0014bd6c:
    psStack_2d8 = (secp256k1_gej *)0x14bd71;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_0014bd71:
    psStack_2d8 = (secp256k1_gej *)0x14bd76;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014bd76:
    psStack_2d8 = (secp256k1_gej *)0x14bd7b;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_0014bd7b:
    psStack_2d8 = (secp256k1_gej *)0x14bd80;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_0014bd80:
    psVar28 = psVar26;
    a_00 = a_02;
    psStack_2d8 = (secp256k1_gej *)0x14bd85;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_0014bd85:
    psStack_2d8 = (secp256k1_gej *)0x14bd8a;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_0014bd8a:
    psStack_2d8 = (secp256k1_gej *)0x14bd8f;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_0014bd8f:
    psStack_2d8 = (secp256k1_gej *)0x14bd94;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_0014bd94:
    psStack_2d8 = (secp256k1_gej *)0x14bd99;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_0014bd99:
    psStack_2d8 = (secp256k1_gej *)0x14bd9e;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_0014bd9e:
    psStack_2d8 = (secp256k1_gej *)0x14bda3;
    secp256k1_modinv64_update_de_62_cold_23();
    a_02 = a_00;
    psVar8 = psVar28;
LAB_0014bda3:
    psStack_2d8 = (secp256k1_gej *)0x14bda8;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_0014bda8:
    psStack_2d8 = (secp256k1_gej *)0x14bdad;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014bdad:
    psStack_2d8 = (secp256k1_gej *)0x14bdb2;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014bdb2:
    psVar23 = psVar18;
    psStack_2d8 = (secp256k1_gej *)0x14bdb7;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0014bdb7:
    uVar27 = (uint)psVar22;
    psStack_2d8 = (secp256k1_gej *)0x14bdbc;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar18 = (secp256k1_gej *)0x1;
    psVar22 = (secp256k1_gej *)0x5;
    psStack_2d8 = (secp256k1_gej *)0x14b219;
    psVar31 = a_02;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar17,
                       1);
    if (-1 < iVar7) goto LAB_0014bd1c;
    psVar22 = (secp256k1_gej *)0x5;
    psVar18 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_2d8 = (secp256k1_gej *)0x14b238;
    psVar31 = a_00;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,(secp256k1_modinv64_signed62 *)psVar17,
                       -2);
    if (iVar7 < 1) goto LAB_0014bd21;
    psVar18 = (secp256k1_gej *)0x1;
    psVar22 = (secp256k1_gej *)0x5;
    psStack_2d8 = (secp256k1_gej *)0x14b255;
    psVar31 = a_00;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,(secp256k1_modinv64_signed62 *)psVar17,
                       1);
    if (-1 < iVar7) goto LAB_0014bd26;
    psStack_2d8 = (secp256k1_gej *)0x14b27b;
    psStack_298 = a_02;
    psStack_270 = psVar28;
    iVar9 = secp256k1_modinv64_abs(uStack_2c0);
    psStack_2d8 = (secp256k1_gej *)0x14b288;
    psVar31 = psStack_2b8;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_2b8);
    psVar18 = (secp256k1_gej *)(0x4000000000000000 - iVar10);
    a_02 = (secp256k1_gej *)0x3fffffffffffffff;
    if ((long)psVar18 < iVar9) goto LAB_0014bd2b;
    psStack_2d8 = (secp256k1_gej *)0x14b2a3;
    iVar9 = secp256k1_modinv64_abs(uStack_2d0);
    psStack_2d8 = (secp256k1_gej *)0x14b2b0;
    psVar31 = psStack_2c8;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_2c8);
    psVar28 = psStack_298;
    psVar18 = (secp256k1_gej *)(0x4000000000000000 - iVar10);
    if ((long)psVar18 < iVar9) goto LAB_0014bd30;
    a_02 = (secp256k1_gej *)0x7fffffffffffffff;
    psVar22 = (secp256k1_gej *)(uStack_2c0 * uVar1);
    psVar18 = SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)uVar1),8);
    uVar41 = (long)psStack_2b8 * (long)psVar26;
    lVar19 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)psVar26),8);
    lVar46 = (0x7fffffffffffffff - lVar19) - (long)psVar18;
    if (-1 < lVar19 &&
        (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar18) !=
        SBORROW8(lVar46,(ulong)((secp256k1_gej *)~uVar41 < psVar22))) !=
        (long)(lVar46 - (ulong)((secp256k1_gej *)~uVar41 < psVar22)) < 0) goto LAB_0014bd35;
    puVar36 = (uint64_t *)((long)(psVar22->x).n + uVar41);
    lVar37 = (long)(psVar18->x).n + (ulong)CARRY8(uVar41,(ulong)psVar22) + lVar19;
    uVar44 = uStack_2d0 * uVar1;
    lVar20 = SUB168(SEXT816((long)uStack_2d0) * SEXT816((long)uVar1),8);
    uVar11 = (long)psStack_2c8 * (long)psVar26;
    lVar21 = SUB168(SEXT816((long)psStack_2c8) * SEXT816((long)psVar26),8);
    uVar41 = (ulong)(-uVar11 - 1 < uVar44);
    lVar46 = (0x7fffffffffffffff - lVar21) - lVar20;
    lVar19 = lVar46 - uVar41;
    bVar47 = (SBORROW8(0x7fffffffffffffff - lVar21,lVar20) != SBORROW8(lVar46,uVar41)) == lVar19 < 0
    ;
    psVar18 = (secp256k1_gej *)CONCAT71((int7)((ulong)lVar19 >> 8),lVar21 < 0 || bVar47);
    if (lVar21 >= 0 && !bVar47) goto LAB_0014bd3a;
    psVar23 = (secp256k1_gej *)((long)psStack_280 >> 0x3f);
    lStack_2a8 = ((ulong)psStack_2b8 & (ulong)psVar23) + (uStack_2c0 & (long)psStack_278 >> 0x3f);
    uVar33 = uVar11 + uVar44;
    psVar31 = (secp256k1_gej *)(lVar21 + lVar20 + (ulong)CARRY8(uVar11,uVar44));
    uVar1 = (psVar17->x).n[0];
    psVar22 = *(secp256k1_gej **)&(psVar17->x).magnitude;
    psVar18 = (secp256k1_gej *)0x3fffffffffffffff;
    lStack_2a8 = lStack_2a8 - ((long)psVar22 * (long)puVar36 + lStack_2a8 & 0x3fffffffffffffffU);
    uVar44 = lStack_2a8 * uVar1;
    lVar19 = SUB168(SEXT816(lStack_2a8) * SEXT816((long)uVar1),8);
    uVar41 = (ulong)((undefined1 *)(-uVar44 - 1) < puVar36);
    lVar46 = (0x7fffffffffffffff - lVar19) - lVar37;
    psVar26 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar44 != 0));
    bVar47 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar37) != SBORROW8(lVar46,uVar41)) ==
             (long)(lVar46 - uVar41) < 0;
    if (lVar19 < 0) {
      bVar47 = (SBORROW8(lVar37,(long)psVar26) !=
               SBORROW8(lVar37 - (long)psVar26,(ulong)(puVar36 < (undefined1 *)-uVar44))) ==
               (long)((lVar37 - (long)psVar26) - (ulong)(puVar36 < (undefined1 *)-uVar44)) < 0;
    }
    psStack_2a0 = a_00;
    psStack_290 = psVar17;
    if (!bVar47) goto LAB_0014bd3f;
    lVar46 = ((ulong)psVar23 & (ulong)psStack_2c8) + ((long)psStack_278 >> 0x3f & uStack_2d0);
    psVar23 = (secp256k1_gej *)(lVar46 - ((long)psVar22 * uVar33 + lVar46 & 0x3fffffffffffffff));
    lVar20 = lVar19 + lVar37 + (ulong)CARRY8(uVar44,(ulong)puVar36);
    uVar11 = (long)psVar23 * uVar1;
    lVar19 = SUB168(SEXT816((long)psVar23) * SEXT816((long)uVar1),8);
    uVar41 = (ulong)(-uVar11 - 1 < uVar33);
    lVar46 = (0x7fffffffffffffff - lVar19) - (long)psVar31;
    psVar22 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar11 != 0));
    bVar47 = (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar31) != SBORROW8(lVar46,uVar41)) ==
             (long)(lVar46 - uVar41) < 0;
    if (lVar19 < 0) {
      bVar47 = (SBORROW8((long)psVar31,(long)psVar22) !=
               SBORROW8((long)psVar31 - (long)psVar22,(ulong)(uVar33 < -uVar11))) ==
               (long)(((long)psVar31 - (long)psVar22) - (ulong)(uVar33 < -uVar11)) < 0;
    }
    if (!bVar47) goto LAB_0014bd44;
    lVar46 = (long)(psVar31->x).n + (ulong)CARRY8(uVar11,uVar33) + lVar19;
    if (((long)puVar36 + uVar44 & 0x3fffffffffffffff) != 0) goto LAB_0014bd49;
    psVar24 = psVar23;
    if ((uVar11 + uVar33 & 0x3fffffffffffffff) != 0) goto LAB_0014bd4e;
    psVar24 = (secp256k1_gej *)0x8000000000000000;
    uVar41 = (ulong)((long)puVar36 + uVar44) >> 0x3e | lVar20 * 4;
    psVar18 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar45 = uStack_2c0 * (long)psStack_258 + uVar41;
    psVar31 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)psStack_258),8) + (lVar20 >> 0x3e) +
              (ulong)CARRY8(uStack_2c0 * (long)psStack_258,uVar41));
    uVar44 = (long)psStack_2b8 * (long)psStack_250;
    lVar21 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)psStack_250),8);
    uVar41 = (ulong)(-uVar44 - 1 < uVar45);
    lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar31;
    lVar37 = (-0x8000000000000000 - lVar21) - (ulong)(uVar44 != 0);
    lVar20 = (long)psVar31 - lVar37;
    bVar47 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar31) != SBORROW8(lVar19,uVar41)) ==
             (long)(lVar19 - uVar41) < 0;
    if (lVar21 < 0) {
      bVar47 = (SBORROW8((long)psVar31,lVar37) != SBORROW8(lVar20,(ulong)(uVar45 < -uVar44))) ==
               (long)(lVar20 - (ulong)(uVar45 < -uVar44)) < 0;
    }
    psVar22 = (secp256k1_gej *)(ulong)bVar47;
    a_02 = psStack_258;
    psVar26 = psStack_250;
    psStack_2b0 = psVar23;
    if (bVar47 == false) goto LAB_0014bd53;
    uVar41 = uVar11 + uVar33 >> 0x3e | lVar46 * 4;
    uVar11 = uVar45 + uVar44;
    psVar31 = (secp256k1_gej *)((long)(psVar31->x).n + (ulong)CARRY8(uVar45,uVar44) + lVar21);
    uVar33 = uStack_2d0 * (long)psStack_258 + uVar41;
    lVar21 = SUB168(SEXT816((long)uStack_2d0) * SEXT816((long)psStack_258),8) + (lVar46 >> 0x3e) +
             (ulong)CARRY8(uStack_2d0 * (long)psStack_258,uVar41);
    uVar44 = (long)psStack_2c8 * (long)psStack_250;
    lVar20 = SUB168(SEXT816((long)psStack_2c8) * SEXT816((long)psStack_250),8);
    uVar41 = (ulong)(-uVar44 - 1 < uVar33);
    lVar46 = (0x7fffffffffffffff - lVar20) - lVar21;
    lVar37 = (-0x8000000000000000 - lVar20) - (ulong)(uVar44 != 0);
    lVar19 = lVar21 - lVar37;
    bVar47 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar21) != SBORROW8(lVar46,uVar41)) ==
             (long)(lVar46 - uVar41) < 0;
    if (lVar20 < 0) {
      bVar47 = (SBORROW8(lVar21,lVar37) != SBORROW8(lVar19,(ulong)(uVar33 < -uVar44))) ==
               (long)(lVar19 - (ulong)(uVar33 < -uVar44)) < 0;
    }
    psVar22 = (secp256k1_gej *)(ulong)bVar47;
    if (bVar47 == false) goto LAB_0014bd58;
    a_02 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar41 = uVar33 + uVar44;
    lVar46 = lVar21 + lVar20 + (ulong)CARRY8(uVar33,uVar44);
    uVar1 = (psVar17->x).n[1];
    if (uVar1 != 0) {
      uVar33 = uVar1 * lStack_2a8;
      lVar20 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_2a8),8);
      uVar44 = (ulong)(-uVar33 - 1 < uVar11);
      lVar19 = (0x7fffffffffffffff - lVar20) - (long)psVar31;
      psVar22 = (secp256k1_gej *)((-0x8000000000000000 - lVar20) - (ulong)(uVar33 != 0));
      bVar47 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar31) != SBORROW8(lVar19,uVar44)) ==
               (long)(lVar19 - uVar44) < 0;
      if (lVar20 < 0) {
        bVar47 = (SBORROW8((long)psVar31,(long)psVar22) !=
                 SBORROW8((long)psVar31 - (long)psVar22,(ulong)(uVar11 < -uVar33))) ==
                 (long)(((long)psVar31 - (long)psVar22) - (ulong)(uVar11 < -uVar33)) < 0;
      }
      psVar18 = psVar23;
      psVar8 = psStack_250;
      if (!bVar47) goto LAB_0014bda3;
      uVar45 = uVar1 * (long)psVar23;
      lVar37 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
      uVar44 = (ulong)(-uVar45 - 1 < uVar41);
      lVar19 = (0x7fffffffffffffff - lVar37) - lVar46;
      lVar43 = (-0x8000000000000000 - lVar37) - (ulong)(uVar45 != 0);
      lVar21 = lVar46 - lVar43;
      psVar8 = (secp256k1_gej *)(lVar21 - (ulong)(uVar41 < -uVar45));
      bVar47 = (SBORROW8(0x7fffffffffffffff - lVar37,lVar46) != SBORROW8(lVar19,uVar44)) ==
               (long)(lVar19 - uVar44) < 0;
      if (lVar37 < 0) {
        bVar47 = (SBORROW8(lVar46,lVar43) != SBORROW8(lVar21,(ulong)(uVar41 < -uVar45))) ==
                 (long)psVar8 < 0;
      }
      psVar22 = (secp256k1_gej *)(ulong)bVar47;
      if (bVar47 != false) {
        bVar47 = CARRY8(uVar11,uVar33);
        uVar11 = uVar11 + uVar33;
        psVar31 = (secp256k1_gej *)((long)(psVar31->x).n + (ulong)bVar47 + lVar20);
        bVar47 = CARRY8(uVar41,uVar45);
        uVar41 = uVar41 + uVar45;
        lVar46 = lVar46 + lVar37 + (ulong)bVar47;
        goto LAB_0014b677;
      }
      goto LAB_0014bda8;
    }
LAB_0014b677:
    uVar44 = (long)psVar31 << 2 | uVar11 >> 0x3e;
    uVar45 = uStack_2c0 * (long)psStack_268 + uVar44;
    psVar31 = (secp256k1_gej *)
              (((long)psVar31 >> 0x3e) +
               SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)psStack_268),8) +
              (ulong)CARRY8(uStack_2c0 * (long)psStack_268,uVar44));
    uVar33 = (long)psStack_2b8 * uStack_260;
    lVar21 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)uStack_260),8);
    uVar44 = (ulong)(-uVar33 - 1 < uVar45);
    lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar31;
    lVar37 = (-0x8000000000000000 - lVar21) - (ulong)(uVar33 != 0);
    lVar20 = (long)psVar31 - lVar37;
    (psStack_298->x).n[0] = uVar11 & 0x3fffffffffffffff;
    (a_00->x).n[0] = uVar41 & 0x3fffffffffffffff;
    bVar47 = (SBORROW8((long)psVar31,lVar37) != SBORROW8(lVar20,(ulong)(uVar45 < -uVar33))) ==
             (long)(lVar20 - (ulong)(uVar45 < -uVar33)) < 0;
    psVar22 = (secp256k1_gej *)(ulong)bVar47;
    bVar5 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar31) != SBORROW8(lVar19,uVar44)) ==
            (long)(lVar19 - uVar44) < 0;
    if (lVar21 < 0) {
      bVar5 = bVar47;
    }
    psVar18 = psStack_268;
    psVar26 = psStack_298;
    if (!bVar5) goto LAB_0014bd5d;
    uVar41 = uVar41 >> 0x3e | lVar46 << 2;
    uVar34 = uVar45 + uVar33;
    psVar31 = (secp256k1_gej *)((long)(psVar31->x).n + (ulong)CARRY8(uVar45,uVar33) + lVar21);
    uVar11 = uStack_2d0 * (long)psStack_268 + uVar41;
    lVar20 = SUB168(SEXT816((long)uStack_2d0) * SEXT816((long)psStack_268),8) + (lVar46 >> 0x3e) +
             (ulong)CARRY8(uStack_2d0 * (long)psStack_268,uVar41);
    uVar44 = (long)psStack_2c8 * uStack_260;
    lVar19 = SUB168(SEXT816((long)psStack_2c8) * SEXT816((long)uStack_260),8);
    uVar41 = (ulong)(-uVar44 - 1 < uVar11);
    lVar46 = (0x7fffffffffffffff - lVar19) - lVar20;
    psVar18 = (secp256k1_gej *)0x8000000000000000;
    psVar24 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar44 != 0));
    bVar47 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar46,uVar41)) ==
             (long)(lVar46 - uVar41) < 0;
    if (lVar19 < 0) {
      bVar47 = (SBORROW8(lVar20,(long)psVar24) !=
               SBORROW8(lVar20 - (long)psVar24,(ulong)(uVar11 < -uVar44))) ==
               (long)((lVar20 - (long)psVar24) - (ulong)(uVar11 < -uVar44)) < 0;
    }
    psVar22 = (secp256k1_gej *)(ulong)bVar47;
    if (bVar47 == false) goto LAB_0014bd62;
    uVar41 = uVar11 + uVar44;
    lVar46 = lVar20 + lVar19 + (ulong)CARRY8(uVar11,uVar44);
    uVar1 = (psVar17->x).n[2];
    if (uVar1 != 0) {
      uVar11 = uVar1 * lStack_2a8;
      lVar20 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_2a8),8);
      uVar44 = (ulong)(-uVar11 - 1 < uVar34);
      lVar19 = (0x7fffffffffffffff - lVar20) - (long)psVar31;
      psVar22 = (secp256k1_gej *)((-0x8000000000000000 - lVar20) - (ulong)(uVar11 != 0));
      bVar47 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar31) != SBORROW8(lVar19,uVar44)) ==
               (long)(lVar19 - uVar44) < 0;
      if (lVar20 < 0) {
        bVar47 = (SBORROW8((long)psVar31,(long)psVar22) !=
                 SBORROW8((long)psVar31 - (long)psVar22,(ulong)(uVar34 < -uVar11))) ==
                 (long)(((long)psVar31 - (long)psVar22) - (ulong)(uVar34 < -uVar11)) < 0;
      }
      psVar8 = psStack_298;
      if (!bVar47) goto LAB_0014bdad;
      uVar33 = uVar1 * (long)psVar23;
      lVar37 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
      uVar44 = (ulong)(-uVar33 - 1 < uVar41);
      lVar19 = (0x7fffffffffffffff - lVar37) - lVar46;
      lVar43 = (-0x8000000000000000 - lVar37) - (ulong)(uVar33 != 0);
      lVar21 = lVar46 - lVar43;
      psVar8 = (secp256k1_gej *)
               (ulong)((SBORROW8(lVar46,lVar43) != SBORROW8(lVar21,(ulong)(uVar41 < -uVar33))) ==
                      (long)(lVar21 - (ulong)(uVar41 < -uVar33)) < 0);
      psVar22 = (secp256k1_gej *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar37,lVar46) != SBORROW8(lVar19,uVar44)) ==
                       (long)(lVar19 - uVar44) < 0);
      if (lVar37 < 0) {
        psVar22 = psVar8;
      }
      if ((char)psVar22 != '\0') {
        bVar47 = CARRY8(uVar34,uVar11);
        uVar34 = uVar34 + uVar11;
        psVar31 = (secp256k1_gej *)((long)(psVar31->x).n + (ulong)bVar47 + lVar20);
        bVar47 = CARRY8(uVar41,uVar33);
        uVar41 = uVar41 + uVar33;
        lVar46 = lVar46 + lVar37 + (ulong)bVar47;
        goto LAB_0014b871;
      }
      goto LAB_0014bdb2;
    }
LAB_0014b871:
    a_02 = (secp256k1_gej *)0x8000000000000000;
    psVar24 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar44 = (long)psVar31 << 2 | uVar34 >> 0x3e;
    uVar33 = uStack_2c0 * uStack_288 + uVar44;
    psVar31 = (secp256k1_gej *)
              (((long)psVar31 >> 0x3e) +
               SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)uStack_288),8) +
              (ulong)CARRY8(uStack_2c0 * uStack_288,uVar44));
    uVar11 = (long)psStack_2b8 * (long)psStack_270;
    lVar21 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)psStack_270),8);
    uVar44 = (ulong)(-uVar11 - 1 < uVar33);
    lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar31;
    lVar37 = (-0x8000000000000000 - lVar21) - (ulong)(uVar11 != 0);
    lVar20 = (long)psVar31 - lVar37;
    (psStack_298->x).n[1] = uVar34 & 0x3fffffffffffffff;
    (a_00->x).n[1] = uVar41 & 0x3fffffffffffffff;
    bVar47 = (SBORROW8((long)psVar31,lVar37) != SBORROW8(lVar20,(ulong)(uVar33 < -uVar11))) ==
             (long)(lVar20 - (ulong)(uVar33 < -uVar11)) < 0;
    psVar22 = (secp256k1_gej *)(ulong)bVar47;
    bVar5 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar31) != SBORROW8(lVar19,uVar44)) ==
            (long)(lVar19 - uVar44) < 0;
    if (lVar21 < 0) {
      bVar5 = bVar47;
    }
    psVar18 = psStack_270;
    if (!bVar5) goto LAB_0014bd67;
    uVar41 = uVar41 >> 0x3e | lVar46 << 2;
    uVar45 = uVar33 + uVar11;
    psVar31 = (secp256k1_gej *)((long)(psVar31->x).n + (ulong)CARRY8(uVar33,uVar11) + lVar21);
    uVar11 = uStack_2d0 * uStack_288 + uVar41;
    lVar20 = SUB168(SEXT816((long)uStack_2d0) * SEXT816((long)uStack_288),8) + (lVar46 >> 0x3e) +
             (ulong)CARRY8(uStack_2d0 * uStack_288,uVar41);
    uVar44 = (long)psStack_2c8 * (long)psStack_270;
    lVar19 = SUB168(SEXT816((long)psStack_2c8) * SEXT816((long)psStack_270),8);
    uVar41 = (ulong)(-uVar44 - 1 < uVar11);
    lVar46 = (0x7fffffffffffffff - lVar19) - lVar20;
    psVar24 = (secp256k1_gej *)(lVar46 - uVar41);
    psVar18 = (secp256k1_gej *)0x8000000000000000;
    a_02 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar44 != 0));
    bVar47 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar46,uVar41)) ==
             (long)psVar24 < 0;
    if (lVar19 < 0) {
      bVar47 = (SBORROW8(lVar20,(long)a_02) !=
               SBORROW8(lVar20 - (long)a_02,(ulong)(uVar11 < -uVar44))) ==
               (long)((lVar20 - (long)a_02) - (ulong)(uVar11 < -uVar44)) < 0;
    }
    psVar22 = (secp256k1_gej *)(ulong)bVar47;
    if (bVar47 == false) goto LAB_0014bd6c;
    uVar41 = uVar11 + uVar44;
    lVar46 = lVar20 + lVar19 + (ulong)CARRY8(uVar11,uVar44);
    uVar1 = (psVar17->x).n[3];
    if (uVar1 == 0) {
LAB_0014ba54:
      a_02 = (secp256k1_gej *)0x8000000000000000;
      uVar44 = (long)psVar31 << 2 | uVar45 >> 0x3e;
      uVar33 = uStack_2c0 * (long)psStack_278 + uVar44;
      psVar31 = (secp256k1_gej *)
                (((long)psVar31 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)psStack_278),8) +
                (ulong)CARRY8(uStack_2c0 * (long)psStack_278,uVar44));
      uVar11 = (long)psStack_2b8 * (long)psStack_280;
      lVar21 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)psStack_280),8);
      uVar44 = (ulong)(-uVar11 - 1 < uVar33);
      lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar31;
      lVar37 = (-0x8000000000000000 - lVar21) - (ulong)(uVar11 != 0);
      lVar20 = (long)psVar31 - lVar37;
      (psStack_298->x).n[2] = uVar45 & 0x3fffffffffffffff;
      (a_00->x).n[2] = uVar41 & 0x3fffffffffffffff;
      bVar47 = (SBORROW8((long)psVar31,lVar37) != SBORROW8(lVar20,(ulong)(uVar33 < -uVar11))) ==
               (long)(lVar20 - (ulong)(uVar33 < -uVar11)) < 0;
      psVar22 = (secp256k1_gej *)(ulong)bVar47;
      bVar5 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar31) != SBORROW8(lVar19,uVar44)) ==
              (long)(lVar19 - uVar44) < 0;
      if (lVar21 < 0) {
        bVar5 = bVar47;
      }
      psVar18 = psStack_280;
      psVar24 = psStack_278;
      if (!bVar5) goto LAB_0014bd71;
      uVar41 = uVar41 >> 0x3e | lVar46 << 2;
      uVar45 = uVar33 + uVar11;
      psVar31 = (secp256k1_gej *)((long)(psVar31->x).n + (ulong)CARRY8(uVar33,uVar11) + lVar21);
      uVar11 = uStack_2d0 * (long)psStack_278 + uVar41;
      lVar21 = SUB168(SEXT816((long)uStack_2d0) * SEXT816((long)psStack_278),8) + (lVar46 >> 0x3e) +
               (ulong)CARRY8(uStack_2d0 * (long)psStack_278,uVar41);
      uVar44 = (long)psStack_2c8 * (long)psStack_280;
      lVar20 = SUB168(SEXT816((long)psStack_2c8) * SEXT816((long)psStack_280),8);
      uVar41 = (ulong)(-uVar44 - 1 < uVar11);
      lVar46 = (0x7fffffffffffffff - lVar20) - lVar21;
      lVar37 = (-0x8000000000000000 - lVar20) - (ulong)(uVar44 != 0);
      lVar19 = lVar21 - lVar37;
      bVar47 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar21) != SBORROW8(lVar46,uVar41)) ==
               (long)(lVar46 - uVar41) < 0;
      if (lVar20 < 0) {
        bVar47 = (SBORROW8(lVar21,lVar37) != SBORROW8(lVar19,(ulong)(uVar11 < -uVar44))) ==
                 (long)(lVar19 - (ulong)(uVar11 < -uVar44)) < 0;
      }
      psVar22 = (secp256k1_gej *)(ulong)bVar47;
      if (bVar47 == false) goto LAB_0014bd76;
      uVar33 = uVar11 + uVar44;
      lVar19 = lVar21 + lVar20 + (ulong)CARRY8(uVar11,uVar44);
      uVar1 = (psVar17->x).n[4];
      uVar44 = uVar1 * lStack_2a8;
      psVar22 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_2a8),8);
      uVar41 = (ulong)(-uVar44 - 1 < uVar45);
      lVar46 = (0x7fffffffffffffff - (long)psVar22) - (long)psVar31;
      psVar26 = (secp256k1_gej *)((-0x8000000000000000 - (long)psVar22) - (ulong)(uVar44 != 0));
      bVar47 = (SBORROW8(0x7fffffffffffffff - (long)psVar22,(long)psVar31) !=
               SBORROW8(lVar46,uVar41)) == (long)(lVar46 - uVar41) < 0;
      if ((long)psVar22 < 0) {
        bVar47 = (SBORROW8((long)psVar31,(long)psVar26) !=
                 SBORROW8((long)psVar31 - (long)psVar26,(ulong)(uVar45 < -uVar44))) ==
                 (long)(((long)psVar31 - (long)psVar26) - (ulong)(uVar45 < -uVar44)) < 0;
      }
      if (!bVar47) goto LAB_0014bd7b;
      uVar11 = uVar1 * (long)psVar23;
      lVar20 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
      psVar24 = (secp256k1_gej *)0x8000000000000000;
      uVar41 = (ulong)(-uVar11 - 1 < uVar33);
      lVar46 = (0x7fffffffffffffff - lVar20) - lVar19;
      a_02 = (secp256k1_gej *)((-0x8000000000000000 - lVar20) - (ulong)(uVar11 != 0));
      bVar47 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar19) != SBORROW8(lVar46,uVar41)) ==
               (long)(lVar46 - uVar41) < 0;
      if (lVar20 < 0) {
        bVar47 = (SBORROW8(lVar19,(long)a_02) !=
                 SBORROW8(lVar19 - (long)a_02,(ulong)(uVar33 < -uVar11))) ==
                 (long)((lVar19 - (long)a_02) - (ulong)(uVar33 < -uVar11)) < 0;
      }
      psVar18 = (secp256k1_gej *)(ulong)bVar47;
      if (bVar47 == false) goto LAB_0014bd80;
      lVar21 = (long)(psVar22->x).n + (ulong)CARRY8(uVar44,uVar45) + (long)(psVar31->x).n;
      lVar46 = lVar20 + lVar19 + (ulong)CARRY8(uVar11,uVar33);
      psVar18 = (secp256k1_gej *)(lVar21 * 4 | uVar44 + uVar45 >> 0x3e);
      (psStack_298->x).n[3] = uVar44 + uVar45 & 0x3fffffffffffffff;
      (a_00->x).n[3] = uVar11 + uVar33 & 0x3fffffffffffffff;
      psVar31 = (secp256k1_gej *)&psVar18[0xd79435e50d7943].x.magnitude;
      psVar22 = (secp256k1_gej *)
                ((lVar21 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar18));
      if (psVar22 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_0014bd85;
      psVar22 = (secp256k1_gej *)0xffffffffffffffff;
      uVar41 = uVar11 + uVar33 >> 0x3e | lVar46 * 4;
      (psStack_298->x).n[4] = (uint64_t)psVar18;
      psVar24 = (secp256k1_gej *)(uVar41 + 0x8000000000000000);
      if ((lVar46 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar41) != -1) goto LAB_0014bd8a;
      (a_00->x).n[4] = uVar41;
      psVar22 = (secp256k1_gej *)0x5;
      psVar18 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_2d8 = (secp256k1_gej *)0x14bca4;
      psVar31 = psStack_298;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psStack_298,5,
                         (secp256k1_modinv64_signed62 *)psVar17,-2);
      if (iVar7 < 1) goto LAB_0014bd8f;
      psVar18 = (secp256k1_gej *)0x1;
      psVar22 = (secp256k1_gej *)0x5;
      psStack_2d8 = (secp256k1_gej *)0x14bcc1;
      psVar31 = psVar28;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar28,5,
                         (secp256k1_modinv64_signed62 *)psVar17,1);
      if (-1 < iVar7) goto LAB_0014bd94;
      psVar22 = (secp256k1_gej *)0x5;
      psVar18 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_2d8 = (secp256k1_gej *)0x14bce0;
      psVar31 = a_00;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_00,5,
                         (secp256k1_modinv64_signed62 *)psVar17,-2);
      if (iVar7 < 1) goto LAB_0014bd99;
      psVar18 = (secp256k1_gej *)0x1;
      psVar22 = (secp256k1_gej *)0x5;
      psStack_2d8 = (secp256k1_gej *)0x14bcfd;
      psVar31 = a_00;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_00,5,
                         (secp256k1_modinv64_signed62 *)psVar17,1);
      if (iVar7 < 0) {
        return;
      }
      goto LAB_0014bd9e;
    }
    psVar24 = (secp256k1_gej *)(uVar1 * lStack_2a8);
    lVar20 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_2a8),8);
    uVar44 = (ulong)(-(long)psVar24 - 1U < uVar45);
    lVar19 = (0x7fffffffffffffff - lVar20) - (long)psVar31;
    a_02 = (secp256k1_gej *)0x8000000000000000;
    psVar22 = (secp256k1_gej *)
              ((-0x8000000000000000 - lVar20) - (ulong)(psVar24 != (secp256k1_gej *)0x0));
    bVar47 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar31) != SBORROW8(lVar19,uVar44)) ==
             (long)(lVar19 - uVar44) < 0;
    if (lVar20 < 0) {
      bVar47 = (SBORROW8((long)psVar31,(long)psVar22) !=
               SBORROW8((long)psVar31 - (long)psVar22,(ulong)(uVar45 < (ulong)-(long)psVar24))) ==
               (long)(((long)psVar31 - (long)psVar22) - (ulong)(uVar45 < (ulong)-(long)psVar24)) < 0
      ;
    }
    psVar8 = psStack_298;
    if (!bVar47) goto LAB_0014bdb7;
    uVar11 = uVar1 * (long)psVar23;
    lVar37 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
    uVar44 = (ulong)(-uVar11 - 1 < uVar41);
    lVar19 = (0x7fffffffffffffff - lVar37) - lVar46;
    lVar43 = (-0x8000000000000000 - lVar37) - (ulong)(uVar11 != 0);
    lVar21 = lVar46 - lVar43;
    psVar8 = (secp256k1_gej *)(lVar21 - (ulong)(uVar41 < -uVar11));
    bVar47 = (SBORROW8(0x7fffffffffffffff - lVar37,lVar46) != SBORROW8(lVar19,uVar44)) ==
             (long)(lVar19 - uVar44) < 0;
    if (lVar37 < 0) {
      bVar47 = (SBORROW8(lVar46,lVar43) != SBORROW8(lVar21,(ulong)(uVar41 < -uVar11))) ==
               (long)psVar8 < 0;
    }
    uVar27 = (uint)bVar47;
    if (bVar47 != false) {
      bVar47 = CARRY8(uVar45,(ulong)psVar24);
      uVar45 = (long)(psVar24->x).n + uVar45;
      psVar31 = (secp256k1_gej *)((long)(psVar31->x).n + (ulong)bVar47 + lVar20);
      bVar47 = CARRY8(uVar41,uVar11);
      uVar41 = uVar41 + uVar11;
      lVar46 = lVar46 + lVar37 + (ulong)bVar47;
      goto LAB_0014ba54;
    }
  }
  psStack_2d8 = (secp256k1_gej *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  a_03 = &sStack_338;
  psStack_2e8 = psVar24;
  psStack_2e0 = a_02;
  psStack_2d8 = psVar8;
  secp256k1_modinv64_mul_62(&sStack_310,(secp256k1_modinv64_signed62 *)psVar31,uVar27,1);
  psVar29 = a;
  secp256k1_modinv64_mul_62(&sStack_338,a,5,(int64_t)psVar23);
  lVar46 = 0;
  while ((ulong)sStack_310.v[lVar46] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_338.v[lVar46]) goto LAB_0014be51;
    lVar46 = lVar46 + 1;
    if (lVar46 == 4) {
      uVar27 = 4;
      while( true ) {
        if (sStack_310.v[uVar27] < sStack_338.v[uVar27]) {
          return;
        }
        if (sStack_338.v[uVar27] < sStack_310.v[uVar27]) break;
        bVar47 = uVar27 == 0;
        uVar27 = uVar27 - 1;
        if (bVar47) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014be51:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar7 = (int)a_03;
  if (iVar7 < 1) {
LAB_0014c110:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0014c115:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0014c11a:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0014c11f:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_0014c124:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0014c129:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar23->x).n[0];
    uVar2 = (psVar23->x).n[1];
    lVar46 = psVar29->v[0];
    lVar19 = *extraout_RDX_00;
    uVar41 = lVar46 * uVar1;
    lVar21 = SUB168(SEXT816(lVar46) * SEXT816((long)uVar1),8);
    uVar44 = lVar19 * uVar2;
    lVar37 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar2),8);
    lVar20 = (0x7fffffffffffffff - lVar37) - lVar21;
    if (-1 < lVar37 &&
        (SBORROW8(0x7fffffffffffffff - lVar37,lVar21) != SBORROW8(lVar20,(ulong)(~uVar44 < uVar41)))
        != (long)(lVar20 - (ulong)(~uVar44 < uVar41)) < 0) goto LAB_0014c115;
    uVar3 = (psVar23->x).n[2];
    lVar21 = lVar37 + lVar21 + (ulong)CARRY8(uVar44,uVar41);
    uVar4 = (psVar23->x).n[3];
    uVar33 = lVar46 * uVar3;
    lVar20 = SUB168(SEXT816(lVar46) * SEXT816((long)uVar3),8);
    uVar45 = lVar19 * uVar4;
    lVar19 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar4),8);
    uVar11 = (ulong)(-uVar45 - 1 < uVar33);
    lVar46 = (0x7fffffffffffffff - lVar19) - lVar20;
    if (-1 < lVar19 &&
        (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar46,uVar11)) !=
        (long)(lVar46 - uVar11) < 0) goto LAB_0014c11a;
    lVar46 = lVar19 + lVar20 + (ulong)CARRY8(uVar45,uVar33);
    if ((uVar44 + uVar41 & 0x3fffffffffffffff) != 0) goto LAB_0014c11f;
    if ((uVar45 + uVar33 & 0x3fffffffffffffff) != 0) goto LAB_0014c124;
    uVar11 = uVar45 + uVar33 >> 0x3e | lVar46 * 4;
    uVar41 = uVar44 + uVar41 >> 0x3e | lVar21 * 4;
    lVar46 = lVar46 >> 0x3e;
    lVar21 = lVar21 >> 0x3e;
    if (iVar7 != 1) {
      psVar12 = (secp256k1_modinv64_signed62 *)((ulong)a_03 & 0xffffffff);
      a_03 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar19 = psVar29->v[(long)a_03];
        uVar33 = lVar19 * uVar1 + uVar41;
        lVar25 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar1),8) + lVar21 +
                 (ulong)CARRY8(lVar19 * uVar1,uVar41);
        lVar20 = extraout_RDX_00[(long)a_03];
        uVar44 = lVar20 * uVar2;
        lVar43 = SUB168(SEXT816(lVar20) * SEXT816((long)uVar2),8);
        uVar41 = (ulong)(-uVar44 - 1 < uVar33);
        lVar21 = (0x7fffffffffffffff - lVar43) - lVar25;
        psVar30 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar40 = (-0x8000000000000000 - lVar43) - (ulong)(uVar44 != 0);
        lVar37 = lVar25 - lVar40;
        bVar47 = (SBORROW8(0x7fffffffffffffff - lVar43,lVar25) != SBORROW8(lVar21,uVar41)) ==
                 (long)(lVar21 - uVar41) < 0;
        if (lVar43 < 0) {
          bVar47 = (SBORROW8(lVar25,lVar40) != SBORROW8(lVar37,(ulong)(uVar33 < -uVar44))) ==
                   (long)(lVar37 - (ulong)(uVar33 < -uVar44)) < 0;
        }
        if (!bVar47) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0014c10b:
          psVar29 = psVar30;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_0014c110;
        }
        uVar34 = lVar19 * uVar3 + uVar11;
        lVar37 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar3),8) + lVar46 +
                 (ulong)CARRY8(lVar19 * uVar3,uVar11);
        uVar45 = lVar20 * uVar4;
        lVar20 = SUB168(SEXT816(lVar20) * SEXT816((long)uVar4),8);
        uVar41 = (ulong)(-uVar45 - 1 < uVar34);
        lVar46 = (0x7fffffffffffffff - lVar20) - lVar37;
        lVar21 = (-0x8000000000000000 - lVar20) - (ulong)(uVar45 != 0);
        lVar19 = lVar37 - lVar21;
        bVar47 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar37) != SBORROW8(lVar46,uVar41)) ==
                 (long)(lVar46 - uVar41) < 0;
        if (lVar20 < 0) {
          bVar47 = (SBORROW8(lVar37,lVar21) != SBORROW8(lVar19,(ulong)(uVar34 < -uVar45))) ==
                   (long)(lVar19 - (ulong)(uVar34 < -uVar45)) < 0;
        }
        if (!bVar47) goto LAB_0014c10b;
        lVar21 = lVar43 + lVar25 + (ulong)CARRY8(uVar44,uVar33);
        lVar46 = lVar20 + lVar37 + (ulong)CARRY8(uVar45,uVar34);
        uVar41 = lVar21 * 4 | uVar44 + uVar33 >> 0x3e;
        psVar29->v[(long)((long)a_03[-1].v + 0x27)] = uVar44 + uVar33 & 0x3fffffffffffffff;
        uVar11 = lVar46 * 4 | uVar45 + uVar34 >> 0x3e;
        extraout_RDX_00[(long)((long)a_03[-1].v + 0x27)] = uVar45 + uVar34 & 0x3fffffffffffffff;
        a_03 = (secp256k1_modinv64_signed62 *)((long)a_03->v + 1);
        lVar46 = lVar46 >> 0x3e;
        lVar21 = lVar21 >> 0x3e;
      } while (psVar12 != a_03);
    }
    if (lVar21 + -1 + (ulong)(0x7fffffffffffffff < uVar41) != -1) goto LAB_0014c129;
    psVar29->v[(long)iVar7 + -1] = uVar41;
    if (lVar46 + -1 + (ulong)(0x7fffffffffffffff < uVar11) == -1) {
      extraout_RDX_00[(long)iVar7 + -1] = uVar11;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar46 = a_03->v[0];
  lVar19 = a_03->v[1];
  lVar20 = a_03->v[2];
  lVar21 = a_03->v[3];
  lVar37 = a_03->v[4];
  lVar43 = 0;
  do {
    if (a_03->v[lVar43] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014c35f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014c364;
    }
    if (0x3fffffffffffffff < a_03->v[lVar43]) goto LAB_0014c35f;
    lVar43 = lVar43 + 1;
  } while (lVar43 != 5);
  iVar7 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,-2);
  if (iVar7 < 1) {
LAB_0014c364:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014c369:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014c36e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar7 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,1);
    if (-1 < iVar7) goto LAB_0014c369;
    uVar41 = lVar37 >> 0x3f;
    uVar33 = (long)psVar29 >> 0x3f;
    uVar44 = ((uVar41 & b->v[0]) + lVar46 ^ uVar33) - uVar33;
    uVar45 = ((long)uVar44 >> 0x3e) + (((uVar41 & b->v[1]) + lVar19 ^ uVar33) - uVar33);
    uVar34 = ((long)uVar45 >> 0x3e) + ((lVar20 + (uVar41 & b->v[2]) ^ uVar33) - uVar33);
    uVar11 = ((long)uVar34 >> 0x3e) + (((uVar41 & b->v[3]) + lVar21 ^ uVar33) - uVar33);
    lVar46 = ((long)uVar11 >> 0x3e) + (((uVar41 & b->v[4]) + lVar37 ^ uVar33) - uVar33);
    uVar33 = lVar46 >> 0x3f;
    uVar41 = (b->v[0] & uVar33) + (uVar44 & 0x3fffffffffffffff);
    uVar45 = ((long)uVar41 >> 0x3e) + (b->v[1] & uVar33) + (uVar45 & 0x3fffffffffffffff);
    uVar44 = ((long)uVar45 >> 0x3e) + (b->v[2] & uVar33) + (uVar34 & 0x3fffffffffffffff);
    uVar11 = ((long)uVar44 >> 0x3e) + (b->v[3] & uVar33) + (uVar11 & 0x3fffffffffffffff);
    uVar33 = (b->v[4] & uVar33) + lVar46 + ((long)uVar11 >> 0x3e);
    a_03->v[0] = uVar41 & 0x3fffffffffffffff;
    a_03->v[1] = uVar45 & 0x3fffffffffffffff;
    a_03->v[2] = uVar44 & 0x3fffffffffffffff;
    a_03->v[3] = uVar11 & 0x3fffffffffffffff;
    a_03->v[4] = uVar33;
    if (0x3fffffffffffffff < uVar33) goto LAB_0014c36e;
    iVar7 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,0);
    if (-1 < iVar7) {
      iVar7 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,1);
      if (iVar7 < 0) {
        return;
      }
      goto LAB_0014c378;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014c378:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_check_overflow(const secp256k1_scalar *a) {
    int yes = 0;
    int no = 0;
    no |= (a->d[3] < SECP256K1_N_3); /* No need for a > check. */
    no |= (a->d[2] < SECP256K1_N_2);
    yes |= (a->d[2] > SECP256K1_N_2) & ~no;
    no |= (a->d[1] < SECP256K1_N_1);
    yes |= (a->d[1] > SECP256K1_N_1) & ~no;
    yes |= (a->d[0] >= SECP256K1_N_0) & ~no;
    return yes;
}